

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O2

void polyscope::anon_unknown_1::buildWarningUI
               (string *warningBaseString,string *warningDetailString,int nRepeats)

{
  double dVar1;
  bool bVar2;
  float fVar3;
  ImVec2 IVar4;
  undefined1 auVar6 [16];
  ImVec2 IVar5;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar13 [12];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 auVar14 [16];
  float local_d8;
  ImVec2 warningModalSize;
  string warningRepeatString;
  float local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [16];
  string local_40;
  undefined1 extraout_var [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  
  auVar6._8_4_ = 0x3f000000;
  auVar6._0_8_ = 0x3f0000003f000000;
  auVar6._12_4_ = 0x3f000000;
  warningRepeatString._M_dataplus._M_p = (pointer)vmovlps_avx(auVar6);
  ImGui::PushStyleVar(5,(ImVec2 *)&warningRepeatString);
  ImGui::OpenPopup("WARNING");
  std::__cxx11::string::string((string *)&warningRepeatString,"",(allocator *)&local_78);
  auVar11._8_56_ = extraout_var_00;
  auVar11._0_8_ = extraout_XMM1_Qa;
  auVar13 = auVar11._4_12_;
  if (0 < nRepeats) {
    std::__cxx11::to_string(&local_40,nRepeats);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &warningModalSize,"(and ",&local_40);
    std::operator+(&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &warningModalSize," similar warnings)");
    std::__cxx11::string::operator=((string *)&warningRepeatString,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&warningModalSize);
    std::__cxx11::string::~string((string *)&local_40);
    auVar12._8_56_ = extraout_var_01;
    auVar12._0_8_ = extraout_XMM1_Qa_00;
    auVar13 = auVar12._4_12_;
  }
  IVar4 = ImGui::CalcTextSize((warningBaseString->_M_dataplus)._M_p,(char *)0x0,false,-1.0);
  IVar5 = ImGui::CalcTextSize((warningDetailString->_M_dataplus)._M_p,(char *)0x0,false,-1.0);
  auVar10._0_8_ = ImGui::CalcTextSize(warningRepeatString._M_dataplus._M_p,(char *)0x0,false,-1.0);
  auVar10._8_56_ = extraout_var;
  local_58 = auVar10._0_16_;
  local_88 = IVar5.x;
  auVar6 = vmaxss_avx(local_58,ZEXT416((uint)local_88));
  local_d8 = IVar4.x;
  auVar6 = vmaxss_avx(auVar6,ZEXT416((uint)local_d8));
  auVar14._0_4_ = (float)view::windowWidth / 5.0;
  auVar14._4_12_ = auVar13;
  auVar6 = vminss_avx(ZEXT416((uint)((float)view::windowWidth * 0.5)),
                      ZEXT416((uint)(auVar6._0_4_ + 50.0)));
  auVar6 = vmaxss_avx(auVar6,auVar14);
  warningModalSize.x = auVar6._0_4_;
  warningModalSize.y = 0.0;
  ImGui::SetNextWindowSize(&warningModalSize,0);
  local_78._M_dataplus._M_p = (pointer)0x3f26a6a73f3ebebf;
  local_78._M_string_length = 0x3f80000000000000;
  ImGui::PushStyleColor(0xb,(ImVec4 *)&local_78);
  bVar2 = ImGui::BeginPopupModal("WARNING",(bool *)0x0,4);
  if (!bVar2) goto LAB_001aa907;
  dVar1 = (double)(warningModalSize.x - local_d8) * 0.5 + -5.0;
  auVar7._0_4_ = (float)dVar1;
  auVar7._4_4_ = (int)((ulong)dVar1 >> 0x20);
  auVar7._8_8_ = 0;
  auVar6 = vmaxss_avx(ZEXT816(0) << 0x40,auVar7);
  fVar3 = auVar6._0_4_;
  if (0.0 < fVar3) {
    ImGui::Indent(fVar3);
  }
  ImGui::TextWrapped("%s",(warningBaseString->_M_dataplus)._M_p);
  if (0.0 < fVar3) {
    ImGui::Unindent(fVar3);
  }
  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Spacing();
  bVar2 = std::operator!=(warningDetailString,"");
  if (bVar2) {
    dVar1 = (double)(warningModalSize.x - local_88) * 0.5 + -5.0;
    auVar8._0_4_ = (float)dVar1;
    auVar8._4_4_ = (int)((ulong)dVar1 >> 0x20);
    auVar8._8_8_ = 0;
    auVar6 = vmaxss_avx(ZEXT816(0) << 0x40,auVar8);
    fVar3 = auVar6._0_4_;
    if (0.0 < fVar3) {
      ImGui::Indent(fVar3);
    }
    ImGui::TextWrapped("%s",(warningDetailString->_M_dataplus)._M_p);
    if (0.0 < fVar3) {
      ImGui::Unindent(fVar3);
    }
  }
  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Spacing();
  bVar2 = std::operator!=(&warningRepeatString,"");
  if (bVar2) {
    dVar1 = (double)(warningModalSize.x - (float)local_58._0_4_) * 0.5 + -5.0;
    auVar9._0_4_ = (float)dVar1;
    auVar9._4_4_ = (int)((ulong)dVar1 >> 0x20);
    auVar9._8_8_ = 0;
    auVar6 = vmaxss_avx(ZEXT816(0) << 0x40,auVar9);
    fVar3 = auVar6._0_4_;
    if (0.0 < fVar3) {
      ImGui::Indent(fVar3);
    }
    ImGui::TextWrapped("%s",warningRepeatString._M_dataplus._M_p);
    if (0.0 < fVar3) {
      ImGui::Unindent(fVar3);
    }
    ImGui::Spacing();
    ImGui::Spacing();
    ImGui::Spacing();
  }
  auVar6 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)((warningModalSize.x + -120.0) * 0.5)));
  fVar3 = auVar6._0_4_;
  if (0.0 < fVar3) {
    ImGui::Indent(fVar3);
  }
  local_78._M_dataplus._M_p = (pointer)vmovlps_avx(SUB6416(ZEXT464(0x42f00000),0));
  bVar2 = ImGui::Button("This is fine.",(ImVec2 *)&local_78);
  if (bVar2) {
LAB_001aa8cb:
    ImGui::CloseCurrentPopup();
    popContext();
  }
  else {
    bVar2 = ImGui::IsKeyPressed(0x20,true);
    if (bVar2) goto LAB_001aa8cb;
  }
  bVar2 = ImGui::IsItemHovered(0);
  if (bVar2) {
    ImGui::SetTooltip("(space to dismiss)");
  }
  if (0.0 < fVar3) {
    ImGui::Unindent(fVar3);
  }
LAB_001aa907:
  ImGui::EndPopup();
  ImGui::PopStyleColor(1);
  ImGui::PopStyleVar(1);
  std::__cxx11::string::~string((string *)&warningRepeatString);
  return;
}

Assistant:

void buildWarningUI(std::string warningBaseString, std::string warningDetailString, int nRepeats) {

  // Center modal window titles
  ImGui::PushStyleVar(ImGuiStyleVar_WindowTitleAlign, ImVec2(0.5, 0.5));

  // == Build the warning dialog
  ImGui::OpenPopup("WARNING");


  std::string warningRepeatString = "";
  if (nRepeats > 0) {
    warningRepeatString = "(and " + std::to_string(nRepeats) + " similar warnings)";
  }

  // Nice size for warning modal
  ImVec2 warningBaseTextSize = ImGui::CalcTextSize(warningBaseString.c_str());
  ImVec2 warningDetailTextSize = ImGui::CalcTextSize(warningDetailString.c_str());
  ImVec2 warningRepeatTextSize = ImGui::CalcTextSize(warningRepeatString.c_str());
  ImVec2 warningMaxTextSize(
      std::max(warningBaseTextSize.x, std::max(warningDetailTextSize.x, warningRepeatTextSize.x)),
      std::max(warningBaseTextSize.y, std::max(warningDetailTextSize.y, warningRepeatTextSize.y)));
  ImVec2 warningModalSize(
      std::max(view::windowWidth / 5.0f, std::min(warningMaxTextSize.x + 50, view::windowWidth / 2.0f)), 0);

  ImGui::SetNextWindowSize(warningModalSize);
  ImGui::PushStyleColor(ImGuiCol_TitleBgActive, ImVec4(190. / 255., 166. / 255., 0, 1.0));
  if (ImGui::BeginPopupModal("WARNING", NULL, ImGuiWindowFlags_NoMove)) {

    // Nice text sizing
    float offset = (warningModalSize.x - warningBaseTextSize.x) / 2.0 - 5;
    offset = std::max(offset, 0.0f);
    bool doIndent = offset > 0;
    if (doIndent) {
      ImGui::Indent(offset);
    }

    // Make base text
    ImGui::TextWrapped("%s", warningBaseString.c_str());
    if (doIndent) {
      ImGui::Unindent(offset);
    }

    ImGui::Spacing();
    ImGui::Spacing();
    ImGui::Spacing();

    // Nice text sizing
    if (warningDetailString != "") {
      offset = (warningModalSize.x - warningDetailTextSize.x) / 2.0 - 5;
      offset = std::max(offset, 0.0f);
      doIndent = offset > 0;
      if (doIndent) {
        ImGui::Indent(offset);
      }

      // Make detail text
      ImGui::TextWrapped("%s", warningDetailString.c_str());
      if (doIndent) {
        ImGui::Unindent(offset);
      }
    }

    ImGui::Spacing();
    ImGui::Spacing();
    ImGui::Spacing();

    // Nice text sizing
    if (warningRepeatString != "") {
      offset = (warningModalSize.x - warningRepeatTextSize.x) / 2.0 - 5;
      offset = std::max(offset, 0.0f);
      doIndent = offset > 0;
      if (doIndent) {
        ImGui::Indent(offset);
      }

      // Make detail text
      ImGui::TextWrapped("%s", warningRepeatString.c_str());
      if (doIndent) {
        ImGui::Unindent(offset);
      }

      ImGui::Spacing();
      ImGui::Spacing();
      ImGui::Spacing();
    }

    // Nice button sizing
    float buttonWidth = 120;
    float buttonOffset = (warningModalSize.x - buttonWidth) / 2.0;
    buttonOffset = std::max(buttonOffset, 0.0f);
    doIndent = buttonOffset > 0;
    if (doIndent) {
      ImGui::Indent(buttonOffset);
    }

    // Make a button
    if (ImGui::Button("This is fine.", ImVec2(buttonWidth, 0)) || ImGui::IsKeyPressed((int)' ')) {
      ImGui::CloseCurrentPopup();
      popContext();
    }
    if (ImGui::IsItemHovered()) ImGui::SetTooltip("(space to dismiss)");

    if (doIndent) {
      ImGui::Unindent(buttonOffset);
    }
  }

  ImGui::EndPopup();
  ImGui::PopStyleColor();

  // Window title
  ImGui::PopStyleVar();
}